

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_no_field_presence.pb.cc
# Opt level: O3

size_t __thiscall
proto2_nofieldpresence_unittest::TestAllMapTypes::ByteSizeLong(TestAllMapTypes *this)

{
  MapField<proto2_nofieldpresence_unittest::TestAllMapTypes_MapInt32ForeignEnumEntry_DoNotUse,_int,_proto2_nofieldpresence_unittest::ForeignEnum,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)14>
  *this_00;
  MapField<proto2_nofieldpresence_unittest::TestAllMapTypes_MapInt32ForeignMessageEntry_DoNotUse,_int,_proto2_nofieldpresence_unittest::ForeignMessage,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)11>
  *this_01;
  MapField<proto2_nofieldpresence_unittest::TestAllMapTypes_MapInt32ExplicitForeignMessageEntry_DoNotUse,_int,_proto2_nofieldpresence_unittest::ExplicitForeignMessage,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)11>
  *this_02;
  long lVar1;
  long lVar2;
  size_t sVar3;
  uint uVar4;
  undefined8 *puVar5;
  ulong uVar6;
  ulong uVar7;
  long *plVar8;
  size_t sVar9;
  uint uVar10;
  long lVar11;
  
  google::protobuf::internal::MapFieldBase::SyncMapWithRepeatedField
            ((MapFieldBase *)&(this->field_0)._impl_);
  uVar7 = (ulong)*(uint *)((long)&this->field_0 + 0x10);
  google::protobuf::internal::MapFieldBase::SyncMapWithRepeatedField
            ((MapFieldBase *)&(this->field_0)._impl_);
  uVar10 = *(uint *)((long)&this->field_0 + 0x18);
  uVar6 = (ulong)uVar10;
  if (uVar10 == *(uint *)((long)&this->field_0 + 0x14)) {
LAB_00ce7ed6:
    this_00 = &(this->field_0)._impl_.map_int32_foreign_enum_;
    google::protobuf::internal::MapFieldBase::SyncMapWithRepeatedField((MapFieldBase *)this_00);
    lVar11 = *(uint *)((long)&this->field_0 + 0x40) + uVar7;
    google::protobuf::internal::MapFieldBase::SyncMapWithRepeatedField((MapFieldBase *)this_00);
    uVar10 = *(uint *)((long)&this->field_0 + 0x44);
    uVar4 = *(uint *)((long)&this->field_0 + 0x48);
    uVar7 = (ulong)uVar4;
    if (uVar4 == uVar10) {
LAB_00ce7eff:
      this_01 = &(this->field_0)._impl_.map_int32_foreign_message_;
      google::protobuf::internal::MapFieldBase::SyncMapWithRepeatedField((MapFieldBase *)this_01);
      lVar11 = (ulong)*(uint *)((long)&this->field_0 + 0x70) + lVar11;
      google::protobuf::internal::MapFieldBase::SyncMapWithRepeatedField((MapFieldBase *)this_01);
      uVar10 = *(uint *)((long)&this->field_0 + 0x78);
      uVar7 = (ulong)uVar10;
      if (uVar10 == *(uint *)((long)&this->field_0 + 0x74)) {
LAB_00ce7f31:
        this_02 = &(this->field_0)._impl_.map_int32_explicit_foreign_message_;
        google::protobuf::internal::MapFieldBase::SyncMapWithRepeatedField((MapFieldBase *)this_02);
        sVar9 = (ulong)*(uint *)((long)&this->field_0 + 0xa0) + lVar11;
        google::protobuf::internal::MapFieldBase::SyncMapWithRepeatedField((MapFieldBase *)this_02);
        uVar10 = *(uint *)((long)&this->field_0 + 0xa8);
        uVar7 = (ulong)uVar10;
        if (uVar10 == *(uint *)((long)&this->field_0 + 0xa4)) {
LAB_00ce7f66:
          sVar9 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                            (&this->super_Message,sVar9,&(this->field_0)._impl_._cached_size_);
          return sVar9;
        }
        plVar8 = *(long **)(*(long *)((long)&(this->field_0)._impl_.
                                             map_int32_explicit_foreign_message_.
                                             super_TypeDefinedMapFieldBase<int,_proto2_nofieldpresence_unittest::ExplicitForeignMessage>
                                             .field_0 + 0x10) + uVar7 * 8);
        if (plVar8 != (long *)0x0) {
          do {
            do {
              sVar3 = google::protobuf::internal::
                      MapEntryFuncs<int,_proto2_nofieldpresence_unittest::ExplicitForeignMessage,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)11>
                      ::ByteSizeLong((int *)(plVar8 + 1),(ExplicitForeignMessage *)(plVar8 + 2));
              sVar9 = sVar9 + sVar3;
              plVar8 = (long *)*plVar8;
            } while (plVar8 != (long *)0x0);
            do {
              uVar10 = (int)uVar7 + 1;
              uVar7 = (ulong)uVar10;
              if (*(uint *)((long)&this->field_0 + 0xa4) <= uVar10) goto LAB_00ce7f66;
              plVar8 = *(long **)(*(long *)((long)&(this->field_0)._impl_.
                                                   map_int32_explicit_foreign_message_.
                                                                                                      
                                                  super_TypeDefinedMapFieldBase<int,_proto2_nofieldpresence_unittest::ExplicitForeignMessage>
                                                  .field_0 + 0x10) + (ulong)uVar10 * 8);
            } while (plVar8 == (long *)0x0);
          } while( true );
        }
      }
      else {
        plVar8 = *(long **)(*(long *)((long)&(this->field_0)._impl_.map_int32_foreign_message_.
                                             super_TypeDefinedMapFieldBase<int,_proto2_nofieldpresence_unittest::ForeignMessage>
                                             .field_0 + 0x10) + uVar7 * 8);
        if (plVar8 != (long *)0x0) {
          do {
            do {
              sVar9 = google::protobuf::internal::
                      MapEntryFuncs<int,_proto2_nofieldpresence_unittest::ForeignMessage,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)11>
                      ::ByteSizeLong((int *)(plVar8 + 1),(ForeignMessage *)(plVar8 + 2));
              lVar11 = lVar11 + sVar9;
              plVar8 = (long *)*plVar8;
            } while (plVar8 != (long *)0x0);
            do {
              uVar10 = (int)uVar7 + 1;
              uVar7 = (ulong)uVar10;
              if (*(uint *)((long)&this->field_0 + 0x74) <= uVar10) goto LAB_00ce7f31;
              plVar8 = *(long **)(*(long *)((long)&(this->field_0)._impl_.map_int32_foreign_message_
                                                   .
                                                  super_TypeDefinedMapFieldBase<int,_proto2_nofieldpresence_unittest::ForeignMessage>
                                                  .field_0 + 0x10) + (ulong)uVar10 * 8);
            } while (plVar8 == (long *)0x0);
          } while( true );
        }
      }
    }
    else {
      puVar5 = *(undefined8 **)
                (*(long *)((long)&(this->field_0)._impl_.map_int32_foreign_enum_.
                                  super_TypeDefinedMapFieldBase<int,_proto2_nofieldpresence_unittest::ForeignEnum>
                                  .field_0 + 0x10) + uVar7 * 8);
      if (puVar5 != (undefined8 *)0x0) {
        do {
          lVar1 = 0x3f;
          if (((long)*(int *)(puVar5 + 1) | 1U) != 0) {
            for (; ((long)*(int *)(puVar5 + 1) | 1U) >> lVar1 == 0; lVar1 = lVar1 + -1) {
            }
          }
          uVar6 = (long)*(int *)((long)puVar5 + 0xc) | 1;
          lVar2 = 0x3f;
          if (uVar6 != 0) {
            for (; uVar6 >> lVar2 == 0; lVar2 = lVar2 + -1) {
            }
          }
          lVar11 = (ulong)((int)lVar2 * 9 + 0x49U >> 6) +
                   (ulong)((int)lVar1 * 9 + 0x49U >> 6) + lVar11 + 3;
          puVar5 = (undefined8 *)*puVar5;
          while (puVar5 == (undefined8 *)0x0) {
            uVar4 = (int)uVar7 + 1;
            uVar7 = (ulong)uVar4;
            if (uVar10 <= uVar4) goto LAB_00ce7eff;
            puVar5 = *(undefined8 **)
                      (*(long *)((long)&(this->field_0)._impl_.map_int32_foreign_enum_.
                                        super_TypeDefinedMapFieldBase<int,_proto2_nofieldpresence_unittest::ForeignEnum>
                                        .field_0 + 0x10) + (ulong)uVar4 * 8);
          }
        } while( true );
      }
    }
  }
  else {
    plVar8 = *(long **)(*(long *)((long)&(this->field_0)._impl_.map_int32_bytes_.
                                         super_TypeDefinedMapFieldBase<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         .field_0 + 0x10) + uVar6 * 8);
    if (plVar8 != (long *)0x0) {
      do {
        do {
          sVar9 = google::protobuf::internal::
                  MapEntryFuncs<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)12>
                  ::ByteSizeLong((int *)(plVar8 + 1),
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(plVar8 + 2));
          uVar7 = uVar7 + sVar9;
          plVar8 = (long *)*plVar8;
        } while (plVar8 != (long *)0x0);
        do {
          uVar10 = (int)uVar6 + 1;
          uVar6 = (ulong)uVar10;
          if (*(uint *)((long)&this->field_0 + 0x14) <= uVar10) goto LAB_00ce7ed6;
          plVar8 = *(long **)(*(long *)((long)&(this->field_0)._impl_.map_int32_bytes_.
                                               super_TypeDefinedMapFieldBase<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                               .field_0 + 0x10) + (ulong)uVar10 * 8);
        } while (plVar8 == (long *)0x0);
      } while( true );
    }
  }
  google::protobuf::internal::protobuf_assumption_failed
            ("node != nullptr",
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map.h"
             ,0x22e);
}

Assistant:

::size_t TestAllMapTypes::ByteSizeLong() const {
  const TestAllMapTypes& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto2_nofieldpresence_unittest.TestAllMapTypes)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // map<int32, bytes> map_int32_bytes = 1;
    {
      total_size +=
          1 * ::google::protobuf::internal::FromIntSize(this_._internal_map_int32_bytes_size());
      for (const auto& entry : this_._internal_map_int32_bytes()) {
        total_size += _pbi::MapEntryFuncs<::int32_t, std::string,
                                       _pbi::WireFormatLite::TYPE_INT32,
                                       _pbi::WireFormatLite::TYPE_BYTES>::ByteSizeLong(entry.first, entry.second);
      }
    }
    // map<int32, .proto2_nofieldpresence_unittest.ForeignEnum> map_int32_foreign_enum = 2;
    {
      total_size +=
          1 * ::google::protobuf::internal::FromIntSize(this_._internal_map_int32_foreign_enum_size());
      for (const auto& entry : this_._internal_map_int32_foreign_enum()) {
        total_size += _pbi::MapEntryFuncs<::int32_t, ::proto2_nofieldpresence_unittest::ForeignEnum,
                                       _pbi::WireFormatLite::TYPE_INT32,
                                       _pbi::WireFormatLite::TYPE_ENUM>::ByteSizeLong(entry.first, entry.second);
      }
    }
    // map<int32, .proto2_nofieldpresence_unittest.ForeignMessage> map_int32_foreign_message = 3;
    {
      total_size +=
          1 * ::google::protobuf::internal::FromIntSize(this_._internal_map_int32_foreign_message_size());
      for (const auto& entry : this_._internal_map_int32_foreign_message()) {
        total_size += _pbi::MapEntryFuncs<::int32_t, ::proto2_nofieldpresence_unittest::ForeignMessage,
                                       _pbi::WireFormatLite::TYPE_INT32,
                                       _pbi::WireFormatLite::TYPE_MESSAGE>::ByteSizeLong(entry.first, entry.second);
      }
    }
    // map<int32, .proto2_nofieldpresence_unittest.ExplicitForeignMessage> map_int32_explicit_foreign_message = 4;
    {
      total_size +=
          1 * ::google::protobuf::internal::FromIntSize(this_._internal_map_int32_explicit_foreign_message_size());
      for (const auto& entry : this_._internal_map_int32_explicit_foreign_message()) {
        total_size += _pbi::MapEntryFuncs<::int32_t, ::proto2_nofieldpresence_unittest::ExplicitForeignMessage,
                                       _pbi::WireFormatLite::TYPE_INT32,
                                       _pbi::WireFormatLite::TYPE_MESSAGE>::ByteSizeLong(entry.first, entry.second);
      }
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}